

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

QMatrix * Sub_QQ(QMatrix *Q1,QMatrix *Q2)

{
  LASErrIdType LVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *QResName;
  QMatrix *QRes;
  QMatrix *Q2_local;
  QMatrix *Q1_local;
  
  Q_Lock(Q1);
  Q_Lock(Q2);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if (Q1->Dim == Q2->Dim) {
      if ((((Q1->Symmetry == Q2->Symmetry) && (Q1->ElOrder == Q2->ElOrder)) && (Q1->Len == Q2->Len))
         && (Q1->El == Q2->El)) {
        QResName = (char *)malloc(0xb0);
        pcVar2 = Q_GetName(Q1);
        sVar3 = strlen(pcVar2);
        pcVar2 = Q_GetName(Q1);
        sVar4 = strlen(pcVar2);
        pcVar2 = (char *)malloc(sVar3 + sVar4 + 10);
        if (((QMatrix *)QResName == (QMatrix *)0x0) || (pcVar2 == (char *)0x0)) {
          pcVar5 = Q_GetName(Q1);
          pcVar6 = Q_GetName(Q2);
          LASError(LASMemAllocErr,"Sub_QQ",pcVar5,pcVar6,(char *)0x0);
          if ((QMatrix *)QResName != (QMatrix *)0x0) {
            free(QResName);
          }
        }
        else {
          pcVar5 = Q_GetName(Q1);
          pcVar6 = Q_GetName(Q2);
          sprintf(pcVar2,"%s - %s",pcVar5,pcVar6);
          Q_Constr((QMatrix *)QResName,pcVar2,Q1->Dim,Q1->Symmetry,Q1->ElOrder,Tempor,False);
          LVar1 = LASResult();
          if (LVar1 == LASOK) {
            ((QMatrix *)QResName)->MultiplD = Q1->MultiplD - Q2->MultiplD;
            ((QMatrix *)QResName)->MultiplU = Q1->MultiplU - Q2->MultiplU;
            ((QMatrix *)QResName)->MultiplL = Q1->MultiplL - Q2->MultiplL;
            ((QMatrix *)QResName)->Len = Q1->Len;
            ((QMatrix *)QResName)->El = Q1->El;
            ((QMatrix *)QResName)->ElSorted = Q1->ElSorted;
            ((QMatrix *)QResName)->DiagElAlloc = Q1->DiagElAlloc;
            ((QMatrix *)QResName)->DiagEl = Q1->DiagEl;
            ((QMatrix *)QResName)->ZeroInDiag = Q1->ZeroInDiag;
            ((QMatrix *)QResName)->InvDiagEl = Q1->InvDiagEl;
            ((QMatrix *)QResName)->UnitRightKer = Q1->UnitRightKer;
            ((QMatrix *)QResName)->RightKerCmp = Q1->RightKerCmp;
            ((QMatrix *)QResName)->UnitLeftKer = Q1->UnitLeftKer;
            ((QMatrix *)QResName)->LeftKerCmp = Q1->LeftKerCmp;
            ((QMatrix *)QResName)->ILUExists = Q1->ILUExists;
            ((QMatrix *)QResName)->ILU = Q1->ILU;
          }
        }
        if (pcVar2 != (char *)0x0) {
          free(pcVar2);
        }
      }
      else {
        pcVar2 = Q_GetName(Q1);
        pcVar5 = Q_GetName(Q2);
        LASError(LASMatrCombErr,"Sub_QQ",pcVar2,pcVar5,(char *)0x0);
        QResName = (char *)0x0;
      }
    }
    else {
      pcVar2 = Q_GetName(Q1);
      pcVar5 = Q_GetName(Q2);
      LASError(LASDimErr,"Sub_QQ",pcVar2,pcVar5,(char *)0x0);
      QResName = (char *)0x0;
    }
  }
  else {
    QResName = (char *)0x0;
  }
  Q_Unlock(Q1);
  Q_Unlock(Q2);
  return (QMatrix *)QResName;
}

Assistant:

QMatrix *Sub_QQ(QMatrix *Q1, QMatrix *Q2)
/* QRes = Q1 - Q2, this operation ist limited to matricies, which are
   derived from the same matrix */
{
    QMatrix *QRes;

    char *QResName;

    Q_Lock(Q1);
    Q_Lock(Q2);
    
    if (LASResult() == LASOK) {
        if (Q1->Dim == Q2->Dim) {
            if (Q1->Symmetry == Q2->Symmetry &&
                Q1->ElOrder == Q2->ElOrder &&
                Q1->Len == Q2->Len &&
                Q1->El == Q2->El) {
                QRes = (QMatrix *)malloc(sizeof(QMatrix));
                QResName = (char *)malloc((strlen(Q_GetName(Q1)) + strlen(Q_GetName(Q1)) + 10)
                           * sizeof(char));
                if (QRes != NULL && QResName != NULL) {
                    sprintf(QResName, "%s - %s", Q_GetName(Q1), Q_GetName(Q2));
                    Q_Constr(QRes, QResName, Q1->Dim, Q1->Symmetry, Q1->ElOrder, Tempor, False);
                    if (LASResult() == LASOK) {
                        QRes->MultiplD = Q1->MultiplD - Q2->MultiplD;
                        QRes->MultiplU = Q1->MultiplU - Q2->MultiplU;
                        QRes->MultiplL = Q1->MultiplL - Q2->MultiplL;
                        QRes->Len = Q1->Len;
                        QRes->El = Q1->El;
                        QRes->ElSorted = Q1->ElSorted;
                        QRes->DiagElAlloc = Q1->DiagElAlloc;
                        QRes->DiagEl = Q1->DiagEl;
                        QRes->ZeroInDiag = Q1->ZeroInDiag;
                        QRes->InvDiagEl = Q1->InvDiagEl;
                        QRes->UnitRightKer = Q1->UnitRightKer;
                        QRes->RightKerCmp = Q1->RightKerCmp;
                        QRes->UnitLeftKer = Q1->UnitLeftKer;
                        QRes->LeftKerCmp = Q1->LeftKerCmp;
                        QRes->ILUExists = Q1->ILUExists;
                        QRes->ILU = Q1->ILU;
                    }
                } else {
                    LASError(LASMemAllocErr, "Sub_QQ", Q_GetName(Q1), Q_GetName(Q2), NULL);
                    if (QRes != NULL)
                        free(QRes);
                }
            
                if (QResName != NULL)
                    free(QResName);
            } else {
                LASError(LASMatrCombErr, "Sub_QQ", Q_GetName(Q1), Q_GetName(Q2), NULL);
                QRes = NULL;
            }
        } else {
            LASError(LASDimErr, "Sub_QQ", Q_GetName(Q1), Q_GetName(Q2), NULL);
            QRes = NULL;
        }
    } else {
        QRes = NULL;
    }

    Q_Unlock(Q1);
    Q_Unlock(Q2);

    return(QRes);
}